

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O1

void leveldb::_Test_NoLogFiles::_RunIt(void)

{
  _Test_NoLogFiles t;
  RecoveryTest RStack_38;
  
  RecoveryTest::RecoveryTest(&RStack_38);
  _Run((_Test_NoLogFiles *)&RStack_38);
  RecoveryTest::~RecoveryTest(&RStack_38);
  return;
}

Assistant:

TEST(RecoveryTest, NoLogFiles) {
  ASSERT_OK(Put("foo", "bar"));
  ASSERT_EQ(1, DeleteLogFiles());
  Open();
  ASSERT_EQ("NOT_FOUND", Get("foo"));
  Open();
  ASSERT_EQ("NOT_FOUND", Get("foo"));
}